

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_solver_utilities.cpp
# Opt level: O2

void __thiscall
solver_utilites_is_converged_Test::solver_utilites_is_converged_Test
          (solver_utilites_is_converged_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0014f8f8;
  return;
}

Assistant:

TEST(solver_utilites, is_converged) {

  // Setup criteria object.
  Convergence_Criteria criteria;
  criteria.min_iterations = 10;
  criteria.max_iteration = 100;
  criteria.tolerance = 1.0e-6;

  // Required minimum iterations not met.
  Convergence_Data data;
  data.iteration = 5;
  data.residual_normalised = criteria.tolerance * 1.0e-1;
  data.residual_max_normalised = criteria.tolerance * 1.0e-1;
  EXPECT_FALSE(criteria.is_converged(data));

  // Max iteration reached (force true converged), but residual is still too high.
  data.iteration = 101;
  data.residual_normalised = criteria.tolerance * 1.0e+1;
  data.residual_max_normalised = criteria.tolerance * 1.0e+2;
  EXPECT_TRUE(criteria.is_converged(data));

  // Residual meets convergence tolerance
  data.iteration = 50;
  data.residual_normalised = criteria.tolerance * 1.0e-1;
  data.residual_max_normalised = criteria.tolerance * 2.0;  // demonstrate max residual higher than tolerance
  EXPECT_TRUE(criteria.is_converged(data));
}